

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall QTableModel::insertRows(QTableModel *this,int row,int count,QModelIndex *param_3)

{
  int iVar1;
  qsizetype qVar2;
  bool bVar3;
  ulong i;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    i = (ulong)(uint)row;
    if (i <= (ulong)(this->verticalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,row);
      iVar1 = (int)(this->horizontalHeaderItems).d.size;
      qVar2 = (this->verticalHeaderItems).d.size;
      QList<QTableWidgetItem_*>::insert
                (&this->verticalHeaderItems,i,(ulong)(uint)count,(parameter_type)0x0);
      if ((int)qVar2 == 0) {
        QList<QTableWidgetItem_*>::resize(&this->tableItems,(long)(iVar1 * count));
      }
      else {
        QList<QTableWidgetItem_*>::insert
                  (&this->tableItems,i * (this->horizontalHeaderItems).d.size,(long)(iVar1 * count),
                   (parameter_type)0x0);
      }
      QAbstractItemModel::endInsertRows();
      bVar3 = true;
      goto LAB_005347b7;
    }
  }
  bVar3 = false;
LAB_005347b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::insertRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row > verticalHeaderItems.size())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    verticalHeaderItems.insert(row, count, 0);
    if (rc == 0)
        tableItems.resize(cc * count);
    else
        tableItems.insert(tableIndex(row, 0), cc * count, 0);
    endInsertRows();
    return true;
}